

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O2

vector vector_create_reserve(size_t type_size,size_t capacity)

{
  vector __ptr;
  void *pvVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uStack_20;
  
  if (type_size == 0) {
    pcVar3 = "Vector invalid type size";
    uStack_20 = 0x6d;
  }
  else {
    __ptr = (vector)malloc(0x20);
    if (__ptr != (vector)0x0) {
      __ptr->type_size = type_size;
      sVar2 = 0x10;
      if (0x10 < capacity) {
        sVar2 = capacity;
      }
      __ptr->capacity = sVar2;
      __ptr->size = 0;
      pvVar1 = malloc(sVar2 * type_size);
      __ptr->data = pvVar1;
      if (pvVar1 != (void *)0x0) {
        return __ptr;
      }
      log_write_impl_va("metacall",99,"vector_create_reserve",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,3,"Vector internal allocation error");
      free(__ptr);
      return (vector)0x0;
    }
    pcVar3 = "Vector allocation error";
    uStack_20 = 0x57;
  }
  log_write_impl_va("metacall",uStack_20,"vector_create_reserve",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                    ,3,pcVar3);
  return (vector)0x0;
}

Assistant:

vector vector_create_reserve(size_t type_size, size_t capacity)
{
	if (type_size > 0)
	{
		vector v = malloc(sizeof(struct vector_type));

		if (v == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Vector allocation error");

			return NULL;
		}

		v->type_size = type_size;
		v->capacity = (capacity < VECTOR_CAPACITY_MIN) ? VECTOR_CAPACITY_MIN : capacity;
		v->size = 0;
		v->data = malloc(v->capacity * v->type_size);

		if (v->data == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Vector internal allocation error");

			free(v);

			return NULL;
		}

		return v;
	}

	log_write("metacall", LOG_LEVEL_ERROR, "Vector invalid type size");

	return NULL;
}